

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

void __thiscall
rangeless::fn::impl::
where<rangeless::fn::impl::in_sorted_by<std::vector<int,std::allocator<int>>,rangeless::fn::by::identity>>
::x_EraseRemove<std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>
          (where<rangeless::fn::impl::in_sorted_by<std::vector<int,std::allocator<int>>,rangeless::fn::by::identity>>
           *this,vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> *cont)

{
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  __first;
  in_sorted_by<std::vector<int,_std::allocator<int>_>,_rangeless::fn::by::identity> pred_copy;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = *(undefined8 *)this;
  uStack_10 = *(undefined8 *)(this + 8);
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X*,std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>,__gnu_cxx::__ops::_Iter_pred<rangeless::fn::impl::where<rangeless::fn::impl::in_sorted_by<std::vector<int,std::allocator<int>>,rangeless::fn::by::identity>>::x_EraseRemove<std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>>(std::vector<rangeless::fn::impl::X,std::allocator<rangeless::fn::impl::X>>&)const::_lambda(rangeless::fn::impl::X_const&)_1_>>
                      ((cont->
                       super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                       )._M_impl.super__Vector_impl_data._M_start,
                       (cont->
                       super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
                       )._M_impl.super__Vector_impl_data._M_finish,
                       (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ast_al[P]rangeless_include_fn_hpp:2153:21)>
                        )&local_18);
  std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::erase
            (cont,(const_iterator)__first._M_current,
             (cont->
             super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
             _M_impl.super__Vector_impl_data._M_finish);
  return;
}

Assistant:

void x_EraseRemove(Container& cont) const
        {
            auto pred_copy = pred;
            cont.erase(
                std::remove_if(
                    cont.begin(), cont.end(),
                    [&pred_copy](const typename Container::value_type& x)
                    {
                        return !pred_copy(x);
                    }),
                cont.end());

           // Using std::not1(pred) instead of the lambda above won't compile:
           // error: no type named 'argument_type'...
           // Can't use std::not_fn because that's c++17.
        }